

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O1

void * custommalloc(size_t __size)

{
  size_t *psVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  TheCustomHeapType *pTVar5;
  pthread_t pVar6;
  char *pcVar7;
  TheCustomHeapType *pTVar8;
  TheCustomHeapType *pTVar9;
  void *extraout_RAX;
  int iVar10;
  size_t sVar11;
  HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  *pHVar12;
  char *pcVar13;
  Entry *pEVar14;
  HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  *this;
  ulong uVar15;
  
  this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
          *)__size;
  bVar4 = isCustomHeapInitialized();
  if (!bVar4) {
    pcVar13 = initBufferPtr + __size;
    if (&xxmalloc::initialized < pcVar13) {
      initBufferPtr = pcVar13;
      abort();
    }
    if (xxmalloc::initialized != '\0') {
      pcVar7 = initBufferPtr;
      initBufferPtr = pcVar13;
      return pcVar7;
    }
    pcVar7 = initBufferPtr;
    initBufferPtr = pcVar13;
    xxmalloc::initialized = 1;
    return pcVar7;
  }
  pTVar5 = getCustomHeap();
  if (__size < 0x401) {
    sVar11 = 0x10;
    if (0x10 < __size) {
      sVar11 = __size;
    }
    uVar15 = sVar11 * 2 - 1;
    lVar3 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    iVar10 = ((uint)lVar3 ^ 0xffffffc0) + 0x3c;
    pEVar14 = (pTVar5->
              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
              )._localHeap._item[iVar10].head.next;
    if (pEVar14 == (Entry *)0x0) {
      pEVar14 = (Entry *)0x0;
    }
    else {
      (pTVar5->
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      )._localHeap._item[iVar10].head.next = pEVar14->next;
    }
    if (pEVar14 != (Entry *)0x0) {
      psVar1 = &(pTVar5->
                super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                )._localHeapBytes;
      *psVar1 = *psVar1 + (-0x10L << ((byte)iVar10 & 0x3f));
      goto LAB_0010aa5c;
    }
  }
  this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
          *)(pTVar5->
            super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
            )._parentHeap;
  if (__size < 0x8001) {
    pVar6 = pthread_self();
    pEVar14 = (Entry *)Hoard::LockMallocHeap<Hoard::SmallHeap>::malloc
                                 ((LockMallocHeap<Hoard::SmallHeap> *)
                                  ((this->super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>
                                   )._heap._item +
                                  *(int *)((long)(this->
                                                 super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>
                                                 )._tidMap._item +
                                          (ulong)((uint)(pVar6 >> 10) & 0x1ffc))),__size);
  }
  else {
    pEVar14 = (Entry *)HL::
                       HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                       ::slowPath(this,__size);
  }
  Hoard::
  RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  ::getSize((RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
             *)this,pEVar14);
LAB_0010aa5c:
  if (pEVar14 != (Entry *)0x0) {
    return pEVar14;
  }
  custommalloc_cold_1();
  pTVar8 = getCustomHeap();
  pTVar5 = pTVar8;
  if (((this != (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                 *)0x0) && (uVar15 = (ulong)this & 0xfffffffffffc0000, uVar15 != 0)) &&
     (pTVar5 = (TheCustomHeapType *)(*(ulong *)(uVar15 + 8) ^ uVar15),
     pTVar5 == (TheCustomHeapType *)0xcafed00d)) {
    uVar2 = *(ulong *)(uVar15 + 0x10);
    pTVar9 = (TheCustomHeapType *)((long)this - *(long *)(uVar15 + 0x48));
    if (*(char *)(uVar15 + 0x18) == '\x01') {
      pHVar12 = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                 *)(uVar2 - 1 & (ulong)pTVar9);
      pTVar5 = pTVar9;
    }
    else {
      pTVar5 = (TheCustomHeapType *)((ulong)pTVar9 / uVar2);
      pHVar12 = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                 *)((ulong)pTVar9 % uVar2);
    }
    pEVar14 = (Entry *)((long)this - (long)pHVar12);
    uVar15 = *(ulong *)(uVar15 + 0x10);
    if ((uVar15 < 0x401) &&
       (pTVar5 = (TheCustomHeapType *)
                 (pTVar8->
                 super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                 )._localHeapBytes,
       (long)(pTVar5->
             super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
             )._pad + uVar15 < 0x1000001)) {
      if (uVar15 < 0x11) {
        uVar15 = 0x10;
      }
      uVar15 = uVar15 * 2 - 1;
      lVar3 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      iVar10 = ((uint)lVar3 ^ 0xffffffc0) + 0x3c;
      pEVar14->next =
           (pTVar8->
           super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
           )._localHeap._item[iVar10].head.next;
      (pTVar8->
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      )._localHeap._item[iVar10].head.next = pEVar14;
      pTVar5 = (TheCustomHeapType *)
               ((long)(pTVar5->
                      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                      )._pad + (0x10L << ((byte)iVar10 & 0x3f)));
      (pTVar8->
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      )._localHeapBytes = (size_t)pTVar5;
    }
    else if ((pHVar12 != this) &&
            ((pTVar5 = (TheCustomHeapType *)((ulong)pEVar14 & 0xfffffffffffc0000),
             pTVar5 != (TheCustomHeapType *)0x0 &&
             (pTVar5 = (TheCustomHeapType *)
                       ((ulong)pTVar5 ^
                       (ulong)(pTVar5->
                              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                              )._pad[1]), pTVar5 == (TheCustomHeapType *)0xcafed00d)))) {
      HL::
      HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
      ::free((HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
              *)(pTVar8->
                super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                )._parentHeap,pEVar14);
      return extraout_RAX;
    }
  }
  return pTVar5;
}

Assistant:

FLATTEN void * MYCDECL CUSTOM_MALLOC(size_t sz)
{
  void * ptr = xxmalloc(sz);
  return ptr;
}